

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

double PopulationCost(uint32_t *population,int length,uint32_t *trivial_sym,uint8_t *is_used)

{
  double dVar1;
  double dVar2;
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  
  (*VP8LGetEntropyUnrefined)(population,length,&bit_entropy,&stats);
  if (trivial_sym != (uint32_t *)0x0) {
    if (bit_entropy.nonzeros != 1) {
      bit_entropy.nonzero_code = 0xffffffff;
    }
    *trivial_sym = bit_entropy.nonzero_code;
  }
  *is_used = stats.streaks[1][1] != 0 || stats.streaks[1][0] != 0;
  dVar1 = BitsEntropyRefine(&bit_entropy);
  dVar2 = FinalHuffmanCost(&stats);
  return dVar2 + dVar1;
}

Assistant:

static double PopulationCost(const uint32_t* const population, int length,
                             uint32_t* const trivial_sym,
                             uint8_t* const is_used) {
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  VP8LGetEntropyUnrefined(population, length, &bit_entropy, &stats);
  if (trivial_sym != NULL) {
    *trivial_sym = (bit_entropy.nonzeros == 1) ? bit_entropy.nonzero_code
                                               : VP8L_NON_TRIVIAL_SYM;
  }
  // The histogram is used if there is at least one non-zero streak.
  *is_used = (stats.streaks[1][0] != 0 || stats.streaks[1][1] != 0);

  return BitsEntropyRefine(&bit_entropy) + FinalHuffmanCost(&stats);
}